

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tc_ecc.c
# Opt level: O1

void tc_uECC_vli_modAdd(tc_uECC_word_t *result,tc_uECC_word_t *left,tc_uECC_word_t *right,
                       tc_uECC_word_t *mod,wordcount_t num_words)

{
  uint *puVar1;
  uint uVar2;
  ulong uVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar3 = (ulong)(byte)num_words;
  uVar5 = uVar3;
  if ('\0' < num_words) {
    uVar7 = 0;
    uVar6 = 0;
    do {
      uVar2 = left[uVar7];
      uVar8 = uVar2 + uVar6 + right[uVar7];
      if (uVar8 != uVar2) {
        uVar6 = 0;
      }
      uVar6 = uVar6 | uVar8 < uVar2;
      result[uVar7] = uVar8;
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
    if (uVar6 != 0) {
      if (num_words < '\x01') {
        return;
      }
      goto LAB_0010735e;
    }
  }
  do {
    uVar5 = uVar5 - 1;
    if ((char)uVar5 < '\0') break;
    uVar7 = (ulong)(((uint)uVar5 & 0x7f) << 2);
    uVar6 = *(uint *)((long)mod + uVar7);
    uVar2 = *(uint *)((long)result + uVar7);
    if (uVar2 < uVar6) {
      bVar4 = true;
      goto LAB_00107352;
    }
  } while (uVar2 <= uVar6);
  bVar4 = false;
LAB_00107352:
  if (num_words < '\x01' || bVar4) {
    return;
  }
LAB_0010735e:
  uVar5 = 0;
  uVar6 = 0;
  do {
    uVar8 = mod[uVar5] + uVar6;
    puVar1 = result + uVar5;
    uVar2 = *puVar1;
    *puVar1 = *puVar1 - uVar8;
    if (uVar8 != 0) {
      uVar6 = 0;
    }
    uVar6 = uVar6 | uVar2 < uVar8;
    uVar5 = uVar5 + 1;
  } while (uVar3 != uVar5);
  return;
}

Assistant:

void tc_uECC_vli_modAdd(tc_uECC_word_t *result, const tc_uECC_word_t *left,
		     const tc_uECC_word_t *right, const tc_uECC_word_t *mod,
		     wordcount_t num_words)
{
	tc_uECC_word_t carry = tc_uECC_vli_add(result, left, right, num_words);
	if (carry || tc_uECC_vli_cmp_unsafe(mod, result, num_words) != 1) {
	/* result > mod (result = mod + remainder), so subtract mod to get
	 * remainder. */
		tc_uECC_vli_sub(result, result, mod, num_words);
	}
}